

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void regularizer_to_weight<dense_parameters>(vw *param_1,bfgs *b,dense_parameters *weights)

{
  weight *pwVar1;
  uint32_t uVar2;
  weight *pwVar3;
  long lVar4;
  ulong uVar5;
  
  if (b->regularizers != (weight *)0x0) {
    uVar2 = weights->_stride_shift;
    pwVar1 = weights->_begin;
    pwVar3 = pwVar1;
    for (lVar4 = 0; (weight *)((long)pwVar1 + lVar4) != pwVar3 + weights->_weight_mask + 1;
        lVar4 = lVar4 + (1L << ((byte)uVar2 & 0x3f)) * 4) {
      uVar5 = (ulong)(lVar4 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
      *(weight *)((long)pwVar1 + lVar4 + 0xc) = b->regularizers[uVar5 * 2];
      *(weight *)((long)pwVar1 + lVar4) = b->regularizers[uVar5 * 2 + 1];
      pwVar3 = weights->_begin;
    }
  }
  return;
}

Assistant:

void regularizer_to_weight(vw& /* all */, bfgs& b, T& weights)
{
  if (b.regularizers != nullptr)
  {
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      (&(*w))[W_COND] = b.regularizers[2 * i];
      *w = b.regularizers[2 * i + 1];
    }
  }
}